

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall
xray_re::cse_alife_monster_abstract::state_read
          (cse_alife_monster_abstract *this,xr_packet *packet,uint16_t size)

{
  cse_alife_creature_abstract::state_read(&this->super_cse_alife_creature_abstract,packet,0);
  if (0x48 < *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28) {
    xr_packet::r_sz(packet,&this->m_out_space_restrictors);
    if (0x49 < *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28) {
      xr_packet::r_sz(packet,&this->m_in_space_restrictors);
      if (0x6f < *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28) {
        xr_packet::r<unsigned_short>(packet,&this->m_smart_terrain_id);
        if (0x71 < *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28) {
          xr_packet::r_bool(packet,&this->m_task_reached);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void cse_alife_monster_abstract::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_creature_abstract::state_read(packet, size);
	if (m_version > CSE_VERSION_0x48) {
		packet.r_sz(m_out_space_restrictors);
		if (m_version > CSE_VERSION_0x49)
			packet.r_sz(m_in_space_restrictors);
	}
	if (m_version > CSE_VERSION_0x6f)
		packet.r_u16(m_smart_terrain_id);
	if (m_version > CSE_VERSION_0x71)
		packet.r_bool(m_task_reached);
}